

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall IntrusiveListTest_emplace_Test::TestBody(IntrusiveListTest_emplace_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator<int> local_151;
  int local_150 [4];
  iterator local_140;
  size_type local_138;
  vector<int,_std::allocator<int>_> local_130;
  allocator<int> local_111;
  int local_110 [4];
  iterator local_100;
  size_type local_f8;
  vector<int,_std::allocator<int>_> local_f0;
  iterator local_d8;
  int local_c8 [2];
  iterator local_c0;
  iterator local_b0;
  int local_a0 [2];
  iterator local_98;
  iterator local_88;
  iterator local_78;
  int local_68 [2];
  iterator local_60;
  iterator local_50;
  int local_40 [2];
  iterator local_38;
  undefined1 local_28 [8];
  TestObjectList list;
  IntrusiveListTest_emplace_Test *this_local;
  
  list.size_ = (size_t)this;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_38 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_40[1] = 2;
  local_40[0] = 200;
  local_50 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::emplace<int,int>
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_38,
                        local_40 + 1,local_40);
  local_60 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_68[1] = 4;
  local_68[0] = 400;
  local_78 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::emplace<int,int>
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_60,
                        local_68 + 1,local_68);
  local_98 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_88 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                       (local_98,1);
  local_a0[1] = 3;
  local_a0[0] = 300;
  local_b0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::emplace<int,int>
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_88,
                        local_a0 + 1,local_a0);
  local_c0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_c8[1] = 1;
  local_c8[0] = 100;
  local_d8 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::emplace<int,int>
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_c0,
                        local_c8 + 1,local_c8);
  local_110[0] = 1;
  local_110[1] = 2;
  local_110[2] = 3;
  local_110[3] = 4;
  local_100 = local_110;
  local_f8 = 4;
  std::allocator<int>::allocator(&local_111);
  __l_00._M_len = local_f8;
  __l_00._M_array = local_100;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_00,&local_111);
  local_150[0] = 100;
  local_150[1] = 200;
  local_150[2] = 300;
  local_150[3] = 400;
  local_140 = local_150;
  local_138 = 4;
  std::allocator<int>::allocator(&local_151);
  __l._M_len = local_138;
  __l._M_array = local_140;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l,&local_151);
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_f0,&local_130);
  std::vector<int,_std::allocator<int>_>::~vector(&local_130);
  std::allocator<int>::~allocator(&local_151);
  std::vector<int,_std::allocator<int>_>::~vector(&local_f0);
  std::allocator<int>::~allocator(&local_111);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, emplace) {
  TestObjectList list;

  // Pass an additional arg to show that forwarding works properly.
  list.emplace(list.begin(), 2, 200);
  list.emplace(list.end(), 4, 400);
  list.emplace(std::next(list.begin()), 3, 300);
  list.emplace(list.begin(), 1, 100);

  AssertListEq(list, {1, 2, 3, 4}, {100, 200, 300, 400});
}